

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

bool_t ValidateSizeSegUID(ebml_binary *p)

{
  char *pcVar1;
  bool_t bVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  uint8_t test [16];
  
  if ((p->Base).DataSize == 0x10) {
    bVar2 = EBML_ElementIsFiniteSize(&p->Base);
    if (bVar2 == 0) {
      uVar3 = 0;
    }
    else if ((p->Base).bValueIsSet == '\0') {
      uVar3 = 1;
    }
    else {
      pcVar1 = (p->Data)._Begin;
      auVar4[0] = -(*pcVar1 == '\0');
      auVar4[1] = -(pcVar1[1] == '\0');
      auVar4[2] = -(pcVar1[2] == '\0');
      auVar4[3] = -(pcVar1[3] == '\0');
      auVar4[4] = -(pcVar1[4] == '\0');
      auVar4[5] = -(pcVar1[5] == '\0');
      auVar4[6] = -(pcVar1[6] == '\0');
      auVar4[7] = -(pcVar1[7] == '\0');
      auVar4[8] = -(pcVar1[8] == '\0');
      auVar4[9] = -(pcVar1[9] == '\0');
      auVar4[10] = -(pcVar1[10] == '\0');
      auVar4[0xb] = -(pcVar1[0xb] == '\0');
      auVar4[0xc] = -(pcVar1[0xc] == '\0');
      auVar4[0xd] = -(pcVar1[0xd] == '\0');
      auVar4[0xe] = -(pcVar1[0xe] == '\0');
      auVar4[0xf] = -(pcVar1[0xf] == '\0');
      uVar3 = (ulong)((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar4[0xf] >> 7) << 0xf) != 0xffff);
    }
    return uVar3;
  }
  return 0;
}

Assistant:

static bool_t ValidateSizeSegUID(const ebml_binary *p)
{
    uint8_t test[16];
    if (p->Base.DataSize != 16 || !EBML_ElementIsFiniteSize((const ebml_element *)p))
        return 0;
    if (!p->Base.bValueIsSet)
        return 1;
    memset(test,0,sizeof(test));
    return memcmp(ARRAYBEGIN(p->Data,uint8_t),test,16)!=0; // make sure the value is not 0
}